

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O3

bool __thiscall svg::Document::save(Document *this)

{
  int iVar1;
  long local_238;
  ofstream ofs;
  int aiStack_218 [54];
  ios_base local_140 [264];
  string local_38;
  
  std::ofstream::ofstream(&local_238,(this->file_name)._M_dataplus._M_p,_S_out);
  iVar1 = *(int *)((long)aiStack_218 + *(long *)(local_238 + -0x18));
  if (iVar1 == 0) {
    toString_abi_cxx11_(&local_38,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,local_38._M_dataplus._M_p,local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    std::ofstream::close();
  }
  local_238 = _VTT;
  *(undefined8 *)((long)&local_238 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&ofs);
  std::ios_base::~ios_base(local_140);
  return iVar1 == 0;
}

Assistant:

bool save() const
        {
            std::ofstream ofs(file_name.c_str());
            if (!ofs.good())
                return false;

            ofs << toString();
            ofs.close();
            return true;
        }